

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<unsigned_long>::AdapterImpl
          (AdapterImpl<unsigned_long> *this,PromiseFulfiller<unsigned_long> *fulfiller,
          Canceler *canceler,Promise<unsigned_long> *inner)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation local_88 [2];
  SourceLocation local_58;
  Canceler *local_40;
  Type local_38;
  Promise<unsigned_long> local_30;
  Promise<unsigned_long> *local_28;
  Promise<unsigned_long> *inner_local;
  Canceler *canceler_local;
  PromiseFulfiller<unsigned_long> *fulfiller_local;
  AdapterImpl<unsigned_long> *this_local;
  
  local_28 = inner;
  inner_local = (Promise<unsigned_long> *)canceler;
  canceler_local = (Canceler *)fulfiller;
  fulfiller_local = (PromiseFulfiller<unsigned_long> *)this;
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_00c12240;
  this->fulfiller = (PromiseFulfiller<unsigned_long> *)canceler_local;
  local_38.fulfiller = (PromiseFulfiller<unsigned_int> *)canceler_local;
  local_40 = canceler_local;
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<unsigned_long>::
  then<kj::Canceler::AdapterImpl<unsigned_long>::AdapterImpl(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&,kj::Promise<unsigned_long>)::_lambda(unsigned_long&&)_1_,kj::Canceler::AdapterImpl<unsigned_long>::PromiseFulfiller(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&,kj::Promise<unsigned_long>)::_lambda(kj::Exception&&)_1_>
            (&local_30,(Type *)inner,&local_38,location);
  SourceLocation::SourceLocation
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location_00.function = local_88[0].function;
  location_00.fileName = local_88[0].fileName;
  location_00.lineNumber = local_88[0].lineNumber;
  location_00.columnNumber = local_88[0].columnNumber;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_30,location_00);
  Promise<void>::~Promise((Promise<void> *)&local_30);
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}